

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makeTiled.cpp
# Opt level: O0

void anon_unknown.dwarf_16f66::storeLevel
               (TiledOutputPart *out,ChannelList *channels,int lx,int ly,Image *image)

{
  undefined1 uVar1;
  int iVar2;
  int iVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  Slice *pSVar4;
  ImageChannel *pIVar5;
  int in_EDX;
  FrameBuffer *in_RDI;
  int x;
  int y;
  char *name;
  ConstIterator i;
  FrameBuffer fb;
  string *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  Slice *__a;
  undefined7 in_stack_ffffffffffffff08;
  int local_dc;
  int local_d8;
  allocator<char> local_d1;
  string local_d0 [32];
  undefined1 local_b0 [56];
  Slice *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  undefined8 local_58;
  char local_50 [60];
  int local_14;
  FrameBuffer *local_8;
  
  local_14 = in_EDX;
  local_8 = in_RDI;
  Imf_3_2::FrameBuffer::FrameBuffer((FrameBuffer *)0x10da4a);
  local_58 = Imf_3_2::ChannelList::begin();
  while( true ) {
    this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           Imf_3_2::ChannelList::end();
    local_70 = this;
    uVar1 = Imf_3_2::operator!=((ConstIterator *)
                                CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                                (ConstIterator *)in_stack_fffffffffffffec8);
    if (!(bool)uVar1) break;
    pSVar4 = (Slice *)Imf_3_2::ChannelList::ConstIterator::name((ConstIterator *)0x10dac1);
    __a = pSVar4;
    local_78 = pSVar4;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this,(char *)CONCAT17(uVar1,in_stack_ffffffffffffff08),(allocator<char> *)__a);
    pIVar5 = Image::channel((Image *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                            in_stack_fffffffffffffec8);
    (*pIVar5->_vptr_ImageChannel[2])(local_b0);
    Imf_3_2::FrameBuffer::insert(local_50,pSVar4);
    std::__cxx11::string::~string(local_d0);
    std::allocator<char>::~allocator(&local_d1);
    Imf_3_2::ChannelList::ConstIterator::operator++
              ((ConstIterator *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  }
  Imf_3_2::TiledOutputPart::setFrameBuffer(local_8);
  local_d8 = 0;
  while( true ) {
    iVar2 = Imf_3_2::TiledOutputPart::numYTiles((int)local_8);
    if (iVar2 <= local_d8) break;
    local_dc = 0;
    while( true ) {
      iVar2 = local_dc;
      iVar3 = Imf_3_2::TiledOutputPart::numXTiles((int)local_8);
      if (iVar3 <= iVar2) break;
      Imf_3_2::TiledOutputPart::writeTile((int)local_8,local_dc,local_d8,local_14);
      local_dc = local_dc + 1;
    }
    local_d8 = local_d8 + 1;
  }
  Imf_3_2::FrameBuffer::~FrameBuffer((FrameBuffer *)0x10dcb7);
  return;
}

Assistant:

void
storeLevel (
    TiledOutputPart&   out,
    const ChannelList& channels,
    int                lx,
    int                ly,
    const Image&       image)
{
    //
    // Store the pixels for level (lx, ly) in output file out.
    //

    FrameBuffer fb;

    for (ChannelList::ConstIterator i = channels.begin (); i != channels.end ();
         ++i)
    {
        const char* name = i.name ();
        fb.insert (name, image.channel (name).slice ());
    }

    out.setFrameBuffer (fb);

    for (int y = 0; y < out.numYTiles (ly); ++y)
        for (int x = 0; x < out.numXTiles (lx); ++x)
            out.writeTile (x, y, lx, ly);
}